

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::UniversalTextureEvaluator::operator()
          (UniversalTextureEvaluator *this,SpectrumTextureHandle *tex,TextureEvalContext ctx,
          SampledWavelengths lambda)

{
  undefined8 uVar1;
  undefined8 uVar2;
  TextureEvalContext ctx_00;
  SampledWavelengths lambda_00;
  array<float,_4> aVar3;
  undefined8 in_RSI;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [56];
  ulong in_XMM1_Qa;
  undefined1 auVar8 [56];
  undefined1 auVar7 [64];
  SampledSpectrum SVar9;
  undefined1 in_stack_00000008 [64];
  undefined8 in_stack_00000048;
  undefined8 in_stack_00000050;
  undefined8 in_stack_00000058;
  undefined8 in_stack_00000060;
  undefined8 in_stack_ffffffffffffff68;
  
  auVar4 = vmovdqu64_avx512f(in_stack_00000008);
  auVar4 = vmovdqu64_avx512f(auVar4);
  auVar5 = vmovdqu64_avx512f(auVar4);
  auVar7 = vmovdqu64_avx512f(auVar5);
  auVar6 = ZEXT856(auVar5._8_8_);
  auVar8 = ZEXT856(in_XMM1_Qa);
  ctx_00._8_8_ = in_stack_00000048;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)auVar7._56_8_;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)auVar7._56_8_ >> 0x20);
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_00000050;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_00000058;
  ctx_00._32_8_ = in_stack_00000060;
  ctx_00._40_8_ = in_stack_ffffffffffffff68;
  ctx_00._48_8_ = in_RSI;
  ctx_00._56_8_ = in_stack_00000048;
  lambda_00.lambda.values._8_8_ = in_stack_00000058;
  lambda_00.lambda.values._0_8_ = in_stack_00000050;
  lambda_00.pdf.values._0_8_ = in_stack_00000060;
  lambda_00.pdf.values[2] = (float)(int)auVar4._0_8_;
  lambda_00.pdf.values[3] = (float)(int)((ulong)auVar4._0_8_ >> 0x20);
  SVar9 = SpectrumTextureHandle::Evaluate(auVar7._24_8_,ctx_00,lambda_00);
  auVar7._0_8_ = SVar9.values.values._8_8_;
  auVar7._8_56_ = auVar8;
  auVar4._0_8_ = SVar9.values.values._0_8_;
  auVar4._8_56_ = auVar6;
  uVar1 = vmovlpd_avx(auVar4._0_16_);
  uVar2 = vmovlpd_avx(auVar7._0_16_);
  aVar3.values[2] = (float)(int)uVar2;
  aVar3.values[3] = (float)(int)((ulong)uVar2 >> 0x20);
  aVar3.values[0] = (float)(int)uVar1;
  aVar3.values[1] = (float)(int)((ulong)uVar1 >> 0x20);
  return (array<float,_4>)(array<float,_4>)aVar3.values;
}

Assistant:

SampledSpectrum UniversalTextureEvaluator::operator()(SpectrumTextureHandle tex,
                                                      TextureEvalContext ctx,
                                                      SampledWavelengths lambda) {
    return tex.Evaluate(ctx, lambda);
}